

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  VpuApiDemoCmdContext_t demoCmdCtx;
  VpuApiDemoCmdContext_t local_1e0;
  
  puts("/*******  vpu api demo in *******/");
  if (argc == 1) {
    show_usage();
    return 0;
  }
  vpuapi_hdl = (void *)dlopen("libvpu.so",0x101);
  if (vpuapi_hdl == (void *)0x0) {
    puts("failed to open libvpu.so");
  }
  else {
    vpuapi_open_ctx = (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_open_context")
    ;
    vpuapi_close_ctx =
         (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_close_context");
    vpuapi_mem_link = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUMemLink");
    vpuapi_mem_free = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUFreeLinear");
    auVar10._0_4_ = -(uint)((int)((ulong)vpuapi_open_ctx >> 0x20) == 0 && (int)vpuapi_open_ctx == 0)
    ;
    auVar10._4_4_ =
         -(uint)((int)vpuapi_close_ctx == 0 && (int)((ulong)vpuapi_close_ctx >> 0x20) == 0);
    auVar10._8_4_ = -(uint)((int)((ulong)vpuapi_mem_link >> 0x20) == 0 && (int)vpuapi_mem_link == 0)
    ;
    auVar10._12_4_ =
         -(uint)((int)vpuapi_mem_free == 0 && (int)((ulong)vpuapi_mem_free >> 0x20) == 0);
    iVar3 = movmskps((int)vpuapi_mem_free,auVar10);
    if (iVar3 == 0) {
      printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n");
      memset(&local_1e0,0,0x1b0);
      local_1e0.codec_type = CODEC_DECODER;
      if (1 < argc) {
        lVar7 = 1;
        bVar9 = false;
LAB_00101481:
        lVar8 = (long)(int)lVar7;
        do {
          lVar7 = lVar8 + 1;
          if (((!bVar9) && (pcVar5 = argv[lVar8], *pcVar5 == '-')) &&
             (bVar1 = pcVar5[1], bVar1 != 0)) {
            if (bVar1 == 0x2d) {
              bVar1 = pcVar5[2];
              if (bVar1 == 0) goto LAB_001016ac;
              pcVar5 = pcVar5 + 1;
            }
            __s1 = pcVar5 + 1;
            if (bVar1 < 0x6f) {
              if (bVar1 == 0x68) {
                if ((pcVar5[2] != '\0') && (iVar3 = strncmp(__s1,"help",4), iVar3 == 0)) {
                  show_help();
                  return 0;
                }
                if (argv[lVar7] == (char *)0x0) {
                  pcVar5 = "input height is invalid";
                  goto LAB_0010172b;
                }
                local_1e0.height = atoi(argv[lVar7]);
              }
              else if (bVar1 == 0x69) {
                pcVar5 = argv[lVar7];
                if (pcVar5 == (char *)0x0) {
                  pcVar5 = "input file is invalid";
                  goto LAB_0010172b;
                }
                sVar6 = strlen(pcVar5);
                memcpy(local_1e0.input_file,pcVar5,sVar6);
                local_1e0.input_file[sVar6] = '\0';
                local_1e0.have_input = '\x01';
              }
              else {
LAB_001015e5:
                cVar2 = pcVar5[2];
                if ((cVar2 == '\0') || (pcVar5 = argv[lVar7], pcVar5 == (char *)0x0)) break;
                iVar3 = strncmp(__s1,"coding",6);
                if (iVar3 == 0) {
                  printf("coding, argv[optindex]: %s",pcVar5);
                  local_1e0.coding = atoi(argv[lVar7]);
                }
                else {
                  iVar3 = strncmp(__s1,"vframes",7);
                  if (iVar3 == 0) {
                    local_1e0.record_frames = atoi(pcVar5);
                  }
                  else {
                    if ((bVar1 != 0x73) || (cVar2 != 's')) break;
                    iVar3 = atoi(pcVar5);
                    local_1e0.record_start_ms = (RK_S64)iVar3;
                  }
                }
              }
            }
            else if (bVar1 == 0x6f) {
              pcVar5 = argv[lVar7];
              if (pcVar5 == (char *)0x0) {
                pcVar5 = "out file is invalid";
LAB_0010172b:
                puts(pcVar5);
                break;
              }
              sVar6 = strlen(pcVar5);
              memcpy(local_1e0.output_file,pcVar5,sVar6);
              local_1e0.output_file[sVar6] = '\0';
              local_1e0.have_output = '\x01';
            }
            else if (bVar1 == 0x74) {
              if (argv[lVar7] == (char *)0x0) {
                pcVar5 = "input codec_type is invalid";
                goto LAB_0010172b;
              }
              local_1e0.codec_type = atoi(argv[lVar7]);
            }
            else {
              if (bVar1 != 0x77) goto LAB_001015e5;
              if (argv[lVar7] == (char *)0x0) {
                pcVar5 = "input width is invalid";
                goto LAB_0010172b;
              }
              local_1e0.width = atoi(argv[lVar7]);
            }
          }
          lVar8 = lVar7;
          if ((long)(ulong)(uint)argc <= lVar7) goto LAB_001016b8;
        } while( true );
      }
      puts("vpu api demo, input parameter invalid");
      show_usage();
      puts("parse_options fail\n");
      show_usage();
      uVar4 = 0xffffff9b;
      goto LAB_001013d3;
    }
    printf("failed to open vpu_open_context %p vpu_close_context %p\n",vpuapi_open_ctx,
           vpuapi_close_ctx);
    printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",vpuapi_mem_link,vpuapi_mem_free);
  }
  uVar4 = 0xffffffff;
LAB_001013d3:
  printf("vpu api demo fail, err: %d\n",(ulong)uVar4);
  if (vpuapi_hdl != (void *)0x0) {
    dlclose();
    vpuapi_hdl = (void *)0x0;
    return uVar4;
  }
  return uVar4;
LAB_001016ac:
  bVar9 = true;
  if (argc <= (int)lVar7) goto LAB_001016b8;
  goto LAB_00101481;
LAB_001016b8:
  if (local_1e0.codec_type == CODEC_ENCODER) {
    uVar4 = vpu_encode_demo(&local_1e0);
  }
  else {
    uVar4 = 0xffffff9b;
    if (local_1e0.codec_type != CODEC_DECODER) goto LAB_001013d3;
    uVar4 = vpu_decode_demo(&local_1e0);
  }
  if (uVar4 == 0) {
    puts("vpu api demo complete OK.");
    return 0;
  }
  goto LAB_001013d3;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    VpuApiDemoCmdContext_t demoCmdCtx;
    VpuApiDemoCmdContext_t *cmd = NULL;

    printf("/*******  vpu api demo in *******/\n");
    if (argc == 1) {
        show_usage();
        return 0;
    }

    /* open library for access */
    vpuapi_hdl = dlopen("libvpu.so", RTLD_LAZY | RTLD_GLOBAL);
    if (NULL == vpuapi_hdl) {
        printf("failed to open libvpu.so\n");
        ret = -1;
        goto DEMO_OUT;
    }

    vpuapi_open_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_open_context");
    vpuapi_close_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_close_context");
    vpuapi_mem_link = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUMemLink");
    vpuapi_mem_free = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUFreeLinear");

    if (NULL == vpuapi_open_ctx || NULL == vpuapi_close_ctx ||
        NULL == vpuapi_mem_link || NULL == vpuapi_mem_free) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",
               vpuapi_open_ctx, vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",
               vpuapi_mem_link, vpuapi_mem_free);
        ret = -1;
        goto DEMO_OUT;
    }

    printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n",
           vpuapi_hdl, vpuapi_open_ctx, vpuapi_close_ctx);

    cmd = &demoCmdCtx;
    memset(cmd, 0, sizeof(VpuApiDemoCmdContext_t));
    cmd->codec_type = CODEC_DECODER;
    if ((ret = parse_options(argc, argv, cmd)) != 0) {
        if (ret == VPU_DEMO_PARSE_HELP_OK) {
            return 0;
        }

        printf("parse_options fail\n\n");
        show_usage();
        DEMO_ERR_RET(ERROR_INVALID_PARAM);
    }

    switch (cmd->codec_type) {
    case CODEC_DECODER : {
        ret = vpu_decode_demo(cmd);
    } break;
    case CODEC_ENCODER : {
        ret = vpu_encode_demo(cmd);
    } break;
    default : {
        ret = ERROR_INVALID_PARAM;
    } break;
    }

DEMO_OUT:
    if (ret) {
        printf("vpu api demo fail, err: %d\n", ret);
        if (vpuapi_hdl) {
            dlclose(vpuapi_hdl);
            vpuapi_hdl = NULL;
        }
    } else {
        printf("vpu api demo complete OK.\n");
    }
    return ret;
}